

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O3

Move<vk::Handle<(vk::HandleType)22>_> * __thiscall
vkt::texture::util::TextureRenderer::makeDescriptorSet
          (Move<vk::Handle<(vk::HandleType)22>_> *__return_storage_ptr__,TextureRenderer *this,
          VkDescriptorPool descriptorPool,VkDescriptorSetLayout setLayout)

{
  DeviceInterface *vk;
  VkDevice device;
  VkDescriptorSetAllocateInfo allocateParams;
  VkDescriptorSetLayout local_58;
  VkDescriptorSetAllocateInfo local_50;
  
  local_58.m_internal = setLayout.m_internal;
  vk = Context::getDeviceInterface(this->m_context);
  device = Context::getDevice(this->m_context);
  local_50.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  local_50.pNext = (void *)0x0;
  local_50.descriptorSetCount = 1;
  local_50.descriptorPool.m_internal = descriptorPool.m_internal;
  local_50.pSetLayouts = &local_58;
  ::vk::allocateDescriptorSet(__return_storage_ptr__,vk,device,&local_50);
  return __return_storage_ptr__;
}

Assistant:

Move<VkDescriptorSet> TextureRenderer::makeDescriptorSet (const VkDescriptorPool descriptorPool, const VkDescriptorSetLayout setLayout) const
{
	const DeviceInterface&						vkd						= m_context.getDeviceInterface();
	const VkDevice								vkDevice				= m_context.getDevice();

	const VkDescriptorSetAllocateInfo			allocateParams			=
	{
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,		// VkStructureType					sType
			DE_NULL,											// const void*						pNext
			descriptorPool,										// VkDescriptorPool					descriptorPool
			1u,													// deUint32							descriptorSetCount
			&setLayout,											// const VkDescriptorSetLayout*		pSetLayouts
	};
	return allocateDescriptorSet(vkd, vkDevice, &allocateParams);
}